

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O2

Promise<void> __thiscall kj::AsyncCapabilityStream::sendFd(AsyncCapabilityStream *this,int fd)

{
  int in_EDX;
  undefined4 in_register_00000034;
  Promise<void> promise;
  Array<int> fds;
  undefined4 local_30;
  
  fds.ptr = kj::_::HeapArrayDisposer::allocate<int>(1);
  fds.size_ = 1;
  fds.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  *fds.ptr = in_EDX;
  local_30 = SUB84(fds.ptr,0);
  (**(code **)(*(long *)CONCAT44(in_register_00000034,fd) + 0x70))
            (&promise,(long *)CONCAT44(in_register_00000034,fd),"",1,0,0,local_30,1);
  Promise<void>::attach<kj::Array<int>>((Promise<void> *)this,(Array<int> *)&promise);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&promise);
  Array<int>::~Array(&fds);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<void> AsyncCapabilityStream::sendFd(int fd) {
  static constexpr byte b = 0;
  auto fds = kj::heapArray<int>(1);
  fds[0] = fd;
  auto promise = writeWithFds(arrayPtr(&b, 1), nullptr, fds);
  return promise.attach(kj::mv(fds));
}